

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void __thiscall ON_BrepFace::~ON_BrepFace(ON_BrepFace *this)

{
  Impl *this_00;
  
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081ebf0;
  DestroyMesh(this,any_mesh);
  ON_SimpleArray<int>::Destroy(&this->m_li);
  this_00 = this->m_pImpl;
  if (this_00 != (Impl *)0x0) {
    Impl::~Impl(this_00);
  }
  operator_delete(this_00,0x58);
  ON_SimpleArray<int>::~ON_SimpleArray(&this->m_li);
  ON_SurfaceProxy::~ON_SurfaceProxy(&this->super_ON_SurfaceProxy);
  return;
}

Assistant:

ON_BrepFace::~ON_BrepFace()
{
  DestroyMesh(ON::any_mesh);
  m_li.Destroy();
  delete m_pImpl;
}